

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O3

string * __thiscall
kratos::SystemVerilogCodeGen::block_label_abi_cxx11_
          (string *__return_storage_ptr__,SystemVerilogCodeGen *this,StmtBlock *stmt)

{
  iterator iVar1;
  StmtBlock *local_20;
  StmtBlock *stmt_local;
  
  local_20 = stmt;
  iVar1 = std::
          _Hashtable<kratos::StmtBlock_*,_std::pair<kratos::StmtBlock_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::StmtBlock_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::StmtBlock_*>,_std::hash<kratos::StmtBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->label_index_)._M_h,&local_20);
  if (iVar1.
      super__Node_iterator_base<std::pair<kratos::StmtBlock_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    iVar1 = std::
            _Hashtable<kratos::StmtBlock_*,_std::pair<kratos::StmtBlock_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::StmtBlock_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::StmtBlock_*>,_std::hash<kratos::StmtBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->label_index_)._M_h,&local_20);
    if (iVar1.
        super__Node_iterator_base<std::pair<kratos::StmtBlock_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      std::__throw_out_of_range("_Map_base::at");
    }
    std::operator+(__return_storage_ptr__," :",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)iVar1.
                          super__Node_iterator_base<std::pair<kratos::StmtBlock_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                          ._M_cur + 0x10));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SystemVerilogCodeGen::block_label(kratos::StmtBlock* stmt) {
    if (label_index_.find(stmt) != label_index_.end())
        return " :" + label_index_.at(stmt);
    else
        return "";
}